

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::Delaunay::InvalidDimension::InvalidDimension
          (InvalidDimension *this,coord_index_t dimension,char *name,char *expected)

{
  _anonymous_namespace_ local_48 [32];
  char *local_28;
  char *expected_local;
  char *name_local;
  InvalidDimension *pIStack_10;
  coord_index_t dimension_local;
  InvalidDimension *this_local;
  
  local_28 = expected;
  expected_local = name;
  name_local._7_1_ = dimension;
  pIStack_10 = this;
  ::(anonymous_namespace)::invalid_dimension_error_abi_cxx11_(local_48,dimension,name,expected);
  std::logic_error::logic_error(&this->super_logic_error,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  *(undefined ***)this = &PTR__InvalidDimension_002ba790;
  return;
}

Assistant:

Delaunay::InvalidDimension::InvalidDimension(
        coord_index_t dimension,
        const char* name,
        const char* expected
    ) :
        std::logic_error(invalid_dimension_error(dimension, name, expected)) {
    }